

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::DOMAttrMapImpl::findNamePoint
          (DOMAttrMapImpl *this,XMLCh *namespaceURI,XMLCh *localName)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  DOMNode *pDVar4;
  DOMNode *pDVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *nLocalName;
  XMLCh *nNamespaceURI;
  DOMNode *node;
  XMLSize_t i;
  XMLSize_t len;
  XMLCh *localName_local;
  XMLCh *namespaceURI_local;
  DOMAttrMapImpl *this_local;
  
  if (this->fNodes != (DOMNodeVector *)0x0) {
    pDVar4 = (DOMNode *)DOMNodeVector::size(this->fNodes);
    for (node = (DOMNode *)0x0; node < pDVar4; node = (DOMNode *)((long)&node->_vptr_DOMNode + 1)) {
      pDVar5 = DOMNodeVector::elementAt(this->fNodes,(XMLSize_t)node);
      iVar2 = (*pDVar5->_vptr_DOMNode[0x16])();
      iVar3 = (*pDVar5->_vptr_DOMNode[0x18])();
      bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar2),namespaceURI);
      if (bVar1) {
        bVar1 = XMLString::equals(localName,(XMLCh *)CONCAT44(extraout_var_00,iVar3));
        if (bVar1) {
LAB_002d98dc:
          return (int)node;
        }
        if ((XMLCh *)CONCAT44(extraout_var_00,iVar3) == (XMLCh *)0x0) {
          iVar2 = (*pDVar5->_vptr_DOMNode[2])();
          bVar1 = XMLString::equals(localName,(XMLCh *)CONCAT44(extraout_var_01,iVar2));
          if (bVar1) goto LAB_002d98dc;
        }
      }
    }
  }
  return -1;
}

Assistant:

int DOMAttrMapImpl::findNamePoint(const XMLCh *namespaceURI,
	const XMLCh *localName) const
{
    if (fNodes == 0)
	return -1;
    // This is a linear search through the same fNodes Vector.
    // The Vector is sorted on the DOM Level 1 nodename.
    // The DOM Level 2 NS keys are namespaceURI and Localname,
    // so we must linear search thru it.
    // In addition, to get this to work with fNodes without any namespace
    // (namespaceURI and localNames are both 0) we then use the nodeName
    // as a secondary key.
    const XMLSize_t len = fNodes -> size();
    for (XMLSize_t i = 0; i < len; ++i) {
        DOMNode *node = fNodes -> elementAt(i);
        const XMLCh * nNamespaceURI = node->getNamespaceURI();
        const XMLCh * nLocalName = node->getLocalName();
        if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
            continue;
        else {
            if (XMLString::equals(localName, nLocalName)
                ||
                (nLocalName == 0 && XMLString::equals(localName, node->getNodeName())))
                return (int)i;
        }
    }
    return -1;	//not found
}